

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

char * ValidateLabel(char *naam,bool setNameSpace,bool ignoreCharAfter)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char *local_40;
  char *lp;
  char *label;
  int truncateAt;
  int labelLen;
  char *np;
  bool inModule;
  bool inMacro;
  bool local;
  bool global;
  bool escMacro;
  bool ignoreCharAfter_local;
  char *pcStack_18;
  bool setNameSpace_local;
  char *naam_local;
  
  if (naam == (char *)0x0) {
    Error("Invalid labelname",(char *)0x0,PASS3);
    naam_local = (char *)0x0;
  }
  else {
    np._7_1_ = setNameSpace;
    pcStack_18 = naam;
    if (*naam == '!') {
      np._7_1_ = 0;
      pcStack_18 = naam + 1;
    }
    bVar4 = false;
    if ((((np._7_1_ & 1) != 0) && (bVar4 = false, macrolabp != (char *)0x0)) &&
       (bVar4 = false, *pcStack_18 == '@')) {
      bVar4 = pcStack_18[1] == '.';
    }
    if (bVar4) {
      pcStack_18 = pcStack_18 + 1;
    }
    bVar5 = *pcStack_18 == '@';
    bVar6 = *pcStack_18 == '.';
    bVar1 = isLabelStart(pcStack_18,true);
    if (bVar1) {
      if ((bVar5) || (bVar6)) {
        pcStack_18 = pcStack_18 + 1;
      }
      bVar1 = false;
      if ((!bVar4) && (bVar1 = false, bVar6)) {
        bVar1 = macrolabp != (char *)0x0;
      }
      bVar4 = false;
      if (((!bVar1) && (bVar4 = false, !bVar5)) && (bVar4 = false, !bVar6)) {
        bVar4 = ModuleName[0] != '\0';
      }
      _truncateAt = pcStack_18;
      while (iVar2 = islabchar(*_truncateAt), iVar2 != 0) {
        _truncateAt = _truncateAt + 1;
      }
      if (*_truncateAt == '[') {
        naam_local = (char *)0x0;
      }
      else if ((*_truncateAt == '\0') || (ignoreCharAfter)) {
        label._4_4_ = (int)_truncateAt - (int)pcStack_18;
        label._0_4_ = 0x40;
        if (0x40 < label._4_4_) {
          Error("Label too long",pcStack_18,IF_FIRST);
        }
        if (bVar1) {
          sVar3 = strlen(macrolabp);
          label._4_4_ = label._4_4_ + (int)sVar3 + 1;
        }
        else if (bVar6) {
          sVar3 = strlen(vorlabp);
          label._4_4_ = label._4_4_ + (int)sVar3 + 1;
        }
        if (bVar4) {
          sVar3 = strlen(ModuleName);
          label._4_4_ = label._4_4_ + (int)sVar3 + 1;
        }
        naam_local = (char *)operator_new__((long)(label._4_4_ + 1));
        if (naam_local == (char *)0x0) {
          ErrorOOM();
        }
        *naam_local = '\0';
        if (bVar4) {
          strncat(naam_local,ModuleName,(long)label._4_4_);
          strncat(naam_local,".",2);
        }
        if (bVar1) {
          strncat(naam_local,macrolabp,(long)label._4_4_);
          strncat(naam_local,">",2);
        }
        else if (bVar6) {
          strncat(naam_local,vorlabp,(long)label._4_4_);
          strncat(naam_local,".",2);
        }
        sVar3 = strlen(naam_local);
        local_40 = naam_local + sVar3;
        while( true ) {
          bVar4 = false;
          if ((int)label != 0) {
            iVar2 = islabchar(*pcStack_18);
            bVar4 = iVar2 != 0;
          }
          if (!bVar4) break;
          *local_40 = *pcStack_18;
          local_40 = local_40 + 1;
          label._0_4_ = (int)label + -1;
          pcStack_18 = pcStack_18 + 1;
        }
        *local_40 = '\0';
        if ((long)label._4_4_ < (long)local_40 - (long)naam_local) {
          Error("internal error",(char *)0x0,FATAL);
        }
        if (((np._7_1_ & 1) != 0) && (!bVar6)) {
          free(vorlabp);
          vorlabp = strdup(naam_local);
          if (vorlabp == (char *)0x0) {
            ErrorOOM();
          }
        }
      }
      else {
        Error("Invalid labelname",pcStack_18,PASS3);
        naam_local = (char *)0x0;
      }
    }
    else {
      if ((bVar5) || (bVar6)) {
        pcStack_18 = pcStack_18 + 1;
      }
      Error("Invalid labelname",pcStack_18,PASS3);
      naam_local = (char *)0x0;
    }
  }
  return naam_local;
}

Assistant:

char* ValidateLabel(const char* naam, bool setNameSpace, bool ignoreCharAfter) {
	if (nullptr == naam) {
		Error("Invalid labelname");
		return nullptr;
	}
	if ('!' == *naam) {
		setNameSpace = false;
		++naam;
	}
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	// regular single prefix case in other use cases
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (!isLabelStart(naam)) {		// isLabelStart assures that only single modifier exist
		if (global || local) ++naam;// single modifier is parsed (even when invalid name)
		Error("Invalid labelname", naam);
		return nullptr;
	}
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && !local && ModuleName[0];
	// check all chars of label
	const char* np = naam;
	while (islabchar(*np)) ++np;
	if ('[' == *np) return nullptr;	// this is DEFARRAY name, do not process it as label (silent exit)
	if (*np && !ignoreCharAfter) {
		// if this is supposed to be new label, there shoulnd't be anything else after it
		Error("Invalid labelname", naam);
		return nullptr;
	}
	// calculate expected length of fully qualified label name
	int labelLen = (np - naam), truncateAt = LABMAX;
	if (LABMAX < labelLen) Error("Label too long", naam, IF_FIRST);	// non-fatal error, will truncate it
	if (inMacro) labelLen += 1 + strlen(macrolabp);
	else if (local) labelLen += 1 + strlen(vorlabp);
	if (inModule) labelLen += 1 + strlen(ModuleName);
	// build fully qualified label name (in newly allocated memory buffer, with precise length)
	char* const label = new char[1+labelLen];
	if (nullptr == label) ErrorOOM();
	label[0] = 0;
	if (inModule) {
		STRCAT(label, labelLen, ModuleName);	STRCAT(label, 2, ".");
	}
	if (inMacro) {
		STRCAT(label, labelLen, macrolabp);		STRCAT(label, 2, ">");
	} else if (local) {
		STRCAT(label, labelLen, vorlabp);		STRCAT(label, 2, ".");
	}
	char* lp = label + strlen(label);
	while (truncateAt-- && islabchar(*naam)) *lp++ = *naam++;	// add the new label (truncated if needed)
	*lp = 0;
	if (labelLen < lp - label) Error("internal error", nullptr, FATAL);		// should never happen :)
	if (setNameSpace && !local) {
		free(vorlabp);
		vorlabp = STRDUP(label);
		if (vorlabp == NULL) ErrorOOM();
	}
	return label;
}